

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O1

bool __thiscall kj::PathPtr::endsWith(PathPtr *this,PathPtr suffix)

{
  ulong uVar1;
  size_t sVar2;
  size_t sVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  String *pSVar11;
  char *pcVar12;
  char *pcVar13;
  String *pSVar14;
  bool bVar15;
  
  uVar8 = suffix.parts.size_;
  pSVar11 = suffix.parts.ptr;
  uVar1 = (this->parts).size_;
  if (uVar1 < uVar8) {
    return false;
  }
  bVar15 = uVar8 == 0;
  if (!bVar15) {
    pSVar14 = (this->parts).ptr + (uVar1 - uVar8);
    sVar2 = (pSVar11->content).size_;
    sVar3 = (pSVar14->content).size_;
    lVar9 = sVar3 + (sVar3 == 0);
    if (lVar9 == sVar2 + (sVar2 == 0)) {
      pcVar13 = "";
      pcVar12 = "";
      if (sVar2 != 0) {
        pcVar12 = (pSVar11->content).ptr;
      }
      if (sVar3 != 0) {
        pcVar13 = (pSVar14->content).ptr;
      }
      iVar6 = bcmp(pcVar13,pcVar12,lVar9 - 1);
      if (iVar6 == 0) {
        lVar9 = 0x20;
        uVar1 = 1;
        do {
          uVar7 = uVar1;
          if (uVar8 == uVar7) break;
          lVar4 = *(long *)((long)&(pSVar11->content).ptr + lVar9);
          lVar5 = *(long *)((long)&(pSVar14->content).ptr + lVar9);
          lVar10 = lVar5 + (ulong)(lVar5 == 0);
          if (lVar10 != lVar4 + (ulong)(lVar4 == 0)) break;
          pcVar12 = "";
          if (lVar4 != 0) {
            pcVar12 = *(char **)((long)pSVar11 + lVar9 + -8);
          }
          pcVar13 = "";
          if (lVar5 != 0) {
            pcVar13 = *(char **)((long)pSVar14 + lVar9 + -8);
          }
          iVar6 = bcmp(pcVar13,pcVar12,lVar10 - 1);
          lVar9 = lVar9 + 0x18;
          uVar1 = uVar7 + 1;
        } while (iVar6 == 0);
        return uVar8 <= uVar7;
      }
    }
    bVar15 = false;
  }
  return bVar15;
}

Assistant:

inline constexpr size_t size() const { return size_; }